

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsocket.c
# Opt level: O0

int mg_socket_options(int sock,mg_session *session)

{
  int iVar1;
  char *pcVar2;
  mg_session *in_RSI;
  int in_EDI;
  socklen_t optlen;
  int optval;
  size_t i;
  size_t OPTCNT;
  anon_struct_12_3_e017cb26 socket_options [5];
  int local_6c;
  ulong local_68;
  undefined8 uVar3;
  int sock_00;
  int local_58 [18];
  mg_session *local_10;
  int local_8;
  
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(local_58,&DAT_00113bf0,0x3c);
  uVar3 = 0;
  local_68 = 0;
  while( true ) {
    if (4 < local_68) {
      return 0;
    }
    local_6c = local_58[local_68 * 3 + 2];
    iVar1 = setsockopt(local_8,local_58[local_68 * 3],local_58[local_68 * 3 + 1],&local_6c,4);
    sock_00 = (int)((ulong)uVar3 >> 0x20);
    if (iVar1 != 0) break;
    local_68 = local_68 + 1;
  }
  pcVar2 = mg_socket_error();
  mg_session_set_error(local_10,"couldn\'t set socket option: %s",pcVar2);
  iVar1 = mg_socket_close(sock_00);
  if (iVar1 == 0) {
    return -8;
  }
  abort();
}

Assistant:

int mg_socket_options(int sock, mg_session *session) {
#ifdef __EMSCRIPTEN__
  (void)sock;
  (void)session;
  return MG_SUCCESS;
#else
  struct {
    int level;
    int optname;
    int optval;
  } socket_options[] = {// disable Nagle algorithm for performance reasons
                        {SOL_TCP, TCP_NODELAY, 1},
                        // turn keep-alive on
                        {SOL_SOCKET, SO_KEEPALIVE, 1},
                        // wait 20s before sending keep-alive packets
                        {SOL_TCP, TCP_KEEPIDLE, 20},
                        // 4 keep-alive packets must fail to close
                        {SOL_TCP, TCP_KEEPCNT, 4},
                        // send keep-alive packets every 15s
                        {SOL_TCP, TCP_KEEPINTVL, 15}};
  const size_t OPTCNT = sizeof(socket_options) / sizeof(socket_options[0]);

  for (size_t i = 0; i < OPTCNT; ++i) {
    int optval = socket_options[i].optval;
    socklen_t optlen = sizeof(optval);

    if (setsockopt(sock, socket_options[i].level, socket_options[i].optname,
                   (void *)&optval, optlen) != 0) {
      mg_session_set_error(session, "couldn't set socket option: %s",
                           mg_socket_error());
      if (mg_socket_close(sock) != 0) {
        abort();
      }
      return MG_ERROR_NETWORK_FAILURE;
    }
  }
  return MG_SUCCESS;
#endif
}